

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O0

void rw::buildStrips(StripMesh *sm)

{
  StripNode *start;
  int local_1c;
  int32 i;
  StripNode *n;
  StripMesh *sm_local;
  
  for (local_1c = 0; local_1c < sm->numNodes; local_1c = local_1c + 1) {
    start = sm->nodes + local_1c;
    if (start->stripId < 0) {
      start->stripId = local_1c;
      extendStrip(sm,start);
    }
  }
  return;
}

Assistant:

static void
buildStrips(StripMesh *sm)
{
	StripNode *n;
	for(int32 i = 0; i < sm->numNodes; i++){
		n = &sm->nodes[i];
		if(n->stripId >= 0)
			continue;
		n->stripId = i;
		extendStrip(sm, n);
	}
}